

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMeshShape.cpp
# Opt level: O0

void __thiscall
btTriangleMeshShape::getAabb
          (btTriangleMeshShape *this,btTransform *trans,btVector3 *aabbMin,btVector3 *aabbMax)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  btTransform *in_RSI;
  btVector3 *in_RDI;
  btVector3 bVar1;
  btVector3 extent;
  btVector3 center;
  btMatrix3x3 abs_b;
  btVector3 localCenter;
  btVector3 localHalfExtents;
  btScalar *in_stack_fffffffffffffec0;
  btVector3 *this_00;
  btVector3 *v2;
  btVector3 *v1;
  btMatrix3x3 *this_01;
  btVector3 *this_02;
  btVector3 *in_stack_fffffffffffffee8;
  btTransform *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  btMatrix3x3 local_b4;
  undefined8 local_84;
  undefined8 local_7c;
  undefined4 local_74;
  undefined8 local_70;
  undefined8 local_68;
  btScalar local_60;
  btScalar local_5c;
  btScalar local_58;
  btVector3 local_54;
  undefined8 local_44;
  undefined8 local_3c;
  undefined4 local_34;
  btVector3 local_30;
  undefined8 *local_20;
  undefined8 *local_18;
  btTransform *local_10;
  
  local_34 = 0x3f000000;
  v2 = in_RDI + 3;
  v1 = in_RDI + 2;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = operator-(v1,v2);
  local_3c = bVar1.m_floats._8_8_;
  local_44 = bVar1.m_floats._0_8_;
  bVar1 = ::operator*(in_stack_fffffffffffffec0,in_RDI);
  local_30.m_floats._8_8_ = bVar1.m_floats._8_8_;
  local_30.m_floats._0_8_ = bVar1.m_floats._0_8_;
  local_58 = (btScalar)(**(code **)(*(long *)in_RDI->m_floats + 0x60))();
  local_5c = (btScalar)(**(code **)(*(long *)in_RDI->m_floats + 0x60))();
  local_60 = (btScalar)(**(code **)(*(long *)in_RDI->m_floats + 0x60))();
  this_00 = &local_54;
  btVector3::btVector3(this_00,&local_58,&local_5c,&local_60);
  this_02 = &local_30;
  btVector3::operator+=(this_02,this_00);
  local_74 = 0x3f000000;
  bVar1 = operator+(v1,v2);
  local_7c = bVar1.m_floats._8_8_;
  local_84 = bVar1.m_floats._0_8_;
  bVar1 = ::operator*(this_00->m_floats,in_RDI);
  local_68 = bVar1.m_floats._8_8_;
  local_70 = bVar1.m_floats._0_8_;
  btTransform::getBasis(local_10);
  this_01 = &local_b4;
  btMatrix3x3::absolute
            ((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  btTransform::operator()(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  btMatrix3x3::operator[](this_01,0);
  btMatrix3x3::operator[](this_01,1);
  btMatrix3x3::operator[](this_01,2);
  btVector3::dot3(this_02,this_01->m_el,v1,v2);
  bVar1 = operator-(v1,v2);
  *local_18 = bVar1.m_floats._0_8_;
  local_18[1] = bVar1.m_floats._8_8_;
  bVar1 = operator+(v1,v2);
  *local_20 = bVar1.m_floats._0_8_;
  local_20[1] = bVar1.m_floats._8_8_;
  return;
}

Assistant:

void btTriangleMeshShape::getAabb(const btTransform& trans,btVector3& aabbMin,btVector3& aabbMax) const
{

	btVector3 localHalfExtents = btScalar(0.5)*(m_localAabbMax-m_localAabbMin);
	localHalfExtents += btVector3(getMargin(),getMargin(),getMargin());
	btVector3 localCenter = btScalar(0.5)*(m_localAabbMax+m_localAabbMin);
	
	btMatrix3x3 abs_b = trans.getBasis().absolute();  

	btVector3 center = trans(localCenter);

    btVector3 extent = localHalfExtents.dot3(abs_b[0], abs_b[1], abs_b[2]);
	aabbMin = center - extent;
	aabbMax = center + extent;
}